

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O2

upb_FieldDef * upb_DefPool_FindExtensionByNameWithSize(upb_DefPool *s,char *name,size_t size)

{
  _Bool _Var1;
  upb_deftype_t uVar2;
  int iVar3;
  uint64_t in_RAX;
  upb_FieldDef *puVar4;
  upb_MessageDef *m;
  upb_MessageDef *puVar5;
  int i;
  int i_00;
  upb_value v;
  
  v.val = in_RAX;
  _Var1 = upb_strtable_lookup2(&s->syms,name,size,&v);
  if (_Var1) {
    uVar2 = _upb_DefType_Type(v);
    if (uVar2 == UPB_DEFTYPE_MSG) {
      m = (upb_MessageDef *)_upb_DefType_Unpack(v,UPB_DEFTYPE_MSG);
      _Var1 = _upb_MessageDef_InMessageSet(m);
      if (!_Var1) {
        return (upb_FieldDef *)0x0;
      }
      i_00 = 0;
      do {
        iVar3 = upb_MessageDef_NestedExtensionCount(m);
        if (iVar3 <= i_00) {
          return (upb_FieldDef *)0x0;
        }
        puVar4 = upb_MessageDef_NestedExtension(m,i_00);
        puVar5 = upb_FieldDef_MessageSubDef(puVar4);
        i_00 = i_00 + 1;
      } while (puVar5 != m);
      return puVar4;
    }
    if (uVar2 == UPB_DEFTYPE_EXT) {
      puVar4 = (upb_FieldDef *)_upb_DefType_Unpack(v,UPB_DEFTYPE_EXT);
      return puVar4;
    }
  }
  return (upb_FieldDef *)0x0;
}

Assistant:

const upb_FieldDef* upb_DefPool_FindExtensionByNameWithSize(
    const upb_DefPool* s, const char* name, size_t size) {
  upb_value v;
  if (!upb_strtable_lookup2(&s->syms, name, size, &v)) return NULL;

  switch (_upb_DefType_Type(v)) {
    case UPB_DEFTYPE_FIELD:
      return _upb_DefType_Unpack(v, UPB_DEFTYPE_FIELD);
    case UPB_DEFTYPE_MSG: {
      const upb_MessageDef* m = _upb_DefType_Unpack(v, UPB_DEFTYPE_MSG);
      if (_upb_MessageDef_InMessageSet(m)) {
        for (int i = 0; i < upb_MessageDef_NestedExtensionCount(m); i++) {
          const upb_FieldDef* ext = upb_MessageDef_NestedExtension(m, i);
          if (upb_FieldDef_MessageSubDef(ext) == m) {
            return ext;
          }
        }
      }
      return NULL;
    }
    default:
      break;
  }

  return NULL;
}